

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
cfd::core::StringUtil::StringToByte
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          string *hex_str)

{
  int iVar1;
  ulong uVar2;
  string *message;
  uchar *bytes_out;
  size_type len;
  undefined8 uVar3;
  allocator_type *in_stack_ffffffffffffff30;
  size_type in_stack_ffffffffffffff38;
  CfdError error_code;
  uint in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  allocator local_91;
  string local_90 [32];
  CfdSourceLocation local_70;
  int local_54;
  size_t sStack_50;
  int ret;
  size_t buf_size;
  undefined1 local_31;
  CfdSourceLocation local_30;
  string *local_18;
  string *hex_str_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer;
  
  local_18 = hex_str;
  hex_str_local = (string *)__return_storage_ptr__;
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    local_31 = 0;
    ::std::__cxx11::string::size();
    ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x3f30b9);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x3f30de);
    sStack_50 = 0;
    message = (string *)::std::__cxx11::string::data();
    bytes_out = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3f3102);
    len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__
                    );
    iVar1 = wally_hex_to_bytes((char *)message,bytes_out,len,&stack0xffffffffffffffb0);
    local_54 = iVar1;
    if (iVar1 != 0) {
      local_70.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_util.cpp"
                   ,0x2f);
      error_code = (CfdError)((ulong)bytes_out >> 0x20);
      local_70.filename = local_70.filename + 1;
      local_70.line = 0x4d7;
      local_70.funcname = "StringToByte";
      logger::warn<int&>(&local_70,"wally_hex_to_bytes NG[{}].",&local_54);
      uVar3 = __cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_90,"hex to byte convert error.",&local_91);
      CfdException::CfdException
                ((CfdException *)CONCAT44(iVar1,in_stack_ffffffffffffff40),error_code,message);
      __cxa_throw(uVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               (ulong)in_stack_ffffffffffffff40,(size_type)bytes_out);
  }
  else {
    local_30.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_util.cpp"
                 ,0x2f);
    local_30.filename = local_30.filename + 1;
    local_30.line = 0x4cd;
    local_30.funcname = "StringToByte";
    logger::info<>(&local_30,"hex_str empty. return empty buffer.");
    memset(__return_storage_ptr__,0,0x18);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3f308d);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> StringUtil::StringToByte(const std::string &hex_str) {
  if (hex_str.empty()) {
    info(CFD_LOG_SOURCE, "hex_str empty. return empty buffer.");
    return std::vector<uint8_t>();
  }
  std::vector<uint8_t> buffer(hex_str.size() + 1);
  size_t buf_size = 0;
  int ret = wally_hex_to_bytes(
      hex_str.data(), buffer.data(), buffer.size(), &buf_size);
  if (ret == WALLY_OK) {
    buffer.resize(buf_size);
  } else {
    warn(CFD_LOG_SOURCE, "wally_hex_to_bytes NG[{}].", ret);
    throw CfdException(kCfdIllegalArgumentError, "hex to byte convert error.");
  }

  return buffer;
}